

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall
ImVector<ImGuiOldColumnData>::push_back(ImVector<ImGuiOldColumnData> *this,ImGuiOldColumnData *v)

{
  undefined8 uVar1;
  ImGuiOldColumnData *pIVar2;
  undefined8 *in_RSI;
  ImVector<ImGuiOldColumnData> *in_RDI;
  ImVector<ImGuiOldColumnData> *unaff_retaddr;
  ImVector<ImGuiOldColumnData> *pIVar3;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar3 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar3 >> 0x20));
  }
  pIVar2 = in_RDI->Data + in_RDI->Size;
  uVar1 = *in_RSI;
  pIVar2->OffsetNorm = (float)(int)uVar1;
  pIVar2->OffsetNormBeforeResize = (float)(int)((ulong)uVar1 >> 0x20);
  uVar1 = in_RSI[1];
  pIVar2->Flags = (int)uVar1;
  (pIVar2->ClipRect).Min.x = (float)(int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&(pIVar2->ClipRect).Min.y = in_RSI[2];
  (pIVar2->ClipRect).Max.y = *(float *)(in_RSI + 3);
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }